

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool Js::JavascriptArray::IsDirectAccessArray(Var aValue)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar2) {
    lVar1 = *aValue;
    bVar2 = true;
    if ((lVar1 != VirtualTableInfo<Js::JavascriptArray>::Address) &&
       (lVar1 != VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)) {
      bVar2 = lVar1 == VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool JavascriptArray::IsDirectAccessArray(Var aValue)
    {
        return VarIs<RecyclableObject>(aValue) &&
            (VirtualTableInfo<JavascriptArray>::HasVirtualTable(aValue) ||
                VirtualTableInfo<JavascriptNativeIntArray>::HasVirtualTable(aValue) ||
                VirtualTableInfo<JavascriptNativeFloatArray>::HasVirtualTable(aValue));
    }